

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage3d_neg_offset
               (NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  GLuint texture;
  NegativeTestContext *ctx_local;
  
  local_14 = 0x1234;
  pNStack_10 = ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindTexture(&pNStack_10->super_CallLogWrapper,0x806f,local_14);
  glu::CallLogWrapper::glTexImage3D
            (&pNStack_10->super_CallLogWrapper,0x806f,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  this = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if xoffset, yoffset or zoffset is negative.",&local_39);
  NegativeTestContext::beginSection(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glCopyTexSubImage3D
            (&pNStack_10->super_CallLogWrapper,0x806f,0,-1,0,0,0,0,4,4);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glCopyTexSubImage3D
            (&pNStack_10->super_CallLogWrapper,0x806f,0,0,-1,0,0,0,4,4);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glCopyTexSubImage3D
            (&pNStack_10->super_CallLogWrapper,0x806f,0,0,0,-1,0,0,4,4);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glCopyTexSubImage3D
            (&pNStack_10->super_CallLogWrapper,0x806f,0,-1,-1,-1,0,0,4,4);
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  glu::CallLogWrapper::glDeleteTextures(&pNStack_10->super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void copytexsubimage3d_neg_offset (NegativeTestContext& ctx)
{
	GLuint texture = 0x1234;
	ctx.glGenTextures	(1, &texture);
	ctx.glBindTexture	(GL_TEXTURE_3D, texture);
	ctx.glTexImage3D	(GL_TEXTURE_3D, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);

	ctx.beginSection("GL_INVALID_VALUE is generated if xoffset, yoffset or zoffset is negative.");
	ctx.glCopyTexSubImage3D(GL_TEXTURE_3D, 0, -1, 0,  0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexSubImage3D(GL_TEXTURE_3D, 0, 0, -1, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexSubImage3D(GL_TEXTURE_3D, 0, 0, 0, -1, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexSubImage3D(GL_TEXTURE_3D, 0, -1, -1, -1, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}